

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer_next.cpp
# Opt level: O2

unique_ptr<pfederc::Token,_std::default_delete<pfederc::Token>_> __thiscall
pfederc::Lexer::nextRegionComment(Lexer *this)

{
  int iVar1;
  Lexer *in_RSI;
  undefined2 local_52;
  unique_ptr<pfederc::Error<pfederc::LexerErrorCode>,_std::default_delete<pfederc::Error<pfederc::LexerErrorCode>_>_>
  local_50;
  undefined1 local_44 [28];
  
  nextChar(in_RSI);
  iVar1 = in_RSI->currentChar;
  if ((iVar1 == 0x21) || (iVar1 == 0x2a)) {
    nextRegionCommentDoc(this);
  }
  else {
    do {
      while (iVar1 != 0x2a) {
        if (iVar1 == -1) {
          local_52 = LEX_ERR_ID_NOT_JUST_ANYS;
          local_44._0_4_ = 10;
          getCurrentCursor((Position *)(local_44 + 4),in_RSI);
          std::
          make_unique<pfederc::Error<pfederc::LexerErrorCode>,pfederc::Level,pfederc::LexerErrorCode,pfederc::Position>
                    ((Level *)&local_50,(LexerErrorCode *)&local_52,(Position *)local_44);
          generateError(this,(unique_ptr<pfederc::Error<pfederc::LexerErrorCode>,_std::default_delete<pfederc::Error<pfederc::LexerErrorCode>_>_>
                              *)in_RSI);
          std::
          unique_ptr<pfederc::Error<pfederc::LexerErrorCode>,_std::default_delete<pfederc::Error<pfederc::LexerErrorCode>_>_>
          ::~unique_ptr(&local_50);
          return (__uniq_ptr_data<pfederc::Token,_std::default_delete<pfederc::Token>,_true,_true>)
                 (__uniq_ptr_data<pfederc::Token,_std::default_delete<pfederc::Token>,_true,_true>)
                 this;
        }
        nextChar(in_RSI);
        iVar1 = in_RSI->currentChar;
      }
      nextChar(in_RSI);
      iVar1 = in_RSI->currentChar;
    } while (iVar1 != 0x2f);
    nextChar(in_RSI);
    nextToken(this);
  }
  return (__uniq_ptr_data<pfederc::Token,_std::default_delete<pfederc::Token>,_true,_true>)
         (__uniq_ptr_data<pfederc::Token,_std::default_delete<pfederc::Token>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Token> Lexer::nextRegionComment() noexcept {
  nextChar(); // eat *
  if (currentChar == '*' || currentChar == '!')
    return nextRegionCommentDoc();

  while (currentChar != EOF) {
    if (currentChar == '*') {
      nextChar(); // eat *
      if (currentChar == '/') {
        nextChar(); // eat /
        return nextToken();
      }

      continue;
    }

    nextChar();
  }

  return generateError(std::make_unique<LexerError>(LVL_ERROR, LexerErrorCode::LEX_ERR_REGION_COMMENT_END,
    getCurrentCursor()));
}